

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  wasm_valtype_t *pwVar4;
  wasm_valtype_t *r;
  wasm_functype_t *pwVar5;
  long lVar6;
  undefined1 local_d8 [8];
  wasm_val_t results [1];
  wasm_val_t args [2];
  wasm_func_t *run_func;
  wasm_extern_vec_t exports;
  wasm_instance_t *instance;
  wasm_extern_t *imports [2];
  wasm_func_t *closure_func;
  wasm_functype_t *closure_type;
  undefined8 uStack_60;
  int i;
  wasm_func_t *print_func;
  wasm_functype_t *print_type;
  wasm_module_t *module;
  wasm_byte_vec_t binary;
  size_t file_size;
  FILE *file;
  wasm_store_t *store;
  wasm_engine_t *engine;
  char **argv_local;
  int argc_local;
  
  printf("Initializing...\n");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  printf("Loading binary...\n");
  __stream = fopen("callback.wasm","r");
  if (__stream == (FILE *)0x0) {
    printf("> Error loading module!\n");
    argv_local._4_4_ = 1;
  }
  else {
    fseek(__stream,0,2);
    binary.data = (wasm_byte_t *)ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&module,binary.data);
    sVar3 = fread((void *)binary.size,(size_t)binary.data,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      printf("Compiling module...\n");
      print_type = (wasm_functype_t *)wasm_module_new(uVar2,&module);
      if (print_type == (wasm_functype_t *)0x0) {
        printf("> Error compiling module!\n");
        argv_local._4_4_ = 1;
      }
      else {
        wasm_byte_vec_delete(&module);
        printf("Creating callback...\n");
        pwVar4 = wasm_valtype_new_i32();
        r = wasm_valtype_new_i32();
        print_func = (wasm_func_t *)wasm_functype_new_1_1(pwVar4,r);
        uStack_60 = wasm_func_new(uVar2,print_func,print_callback);
        closure_type._4_4_ = 0x2a;
        pwVar4 = wasm_valtype_new_i32();
        pwVar5 = wasm_functype_new_0_1(pwVar4);
        imports[1] = (wasm_extern_t *)
                     wasm_func_new_with_env(uVar2,pwVar5,closure_callback,(long)&closure_type + 4,0)
        ;
        wasm_functype_delete(print_func);
        wasm_functype_delete(pwVar5);
        printf("Instantiating module...\n");
        instance = (wasm_instance_t *)wasm_func_as_extern(uStack_60);
        imports[0] = (wasm_extern_t *)wasm_func_as_extern(imports[1]);
        exports.data = (wasm_extern_t **)wasm_instance_new(uVar2,print_type,&instance,0);
        if (exports.data == (wasm_extern_t **)0x0) {
          printf("> Error instantiating module!\n");
          argv_local._4_4_ = 1;
        }
        else {
          wasm_func_delete(uStack_60);
          wasm_func_delete(imports[1]);
          printf("Extracting export...\n");
          wasm_instance_exports(exports.data,&run_func);
          if (run_func == (wasm_func_t *)0x0) {
            printf("> Error accessing exports!\n");
            argv_local._4_4_ = 1;
          }
          else {
            lVar6 = wasm_extern_as_func(*(undefined8 *)exports.size);
            if (lVar6 == 0) {
              printf("> Error accessing export!\n");
              argv_local._4_4_ = 1;
            }
            else {
              wasm_module_delete(print_type);
              wasm_instance_delete(exports.data);
              printf("Calling export...\n");
              results[0].of.i32._0_1_ = 0;
              lVar6 = wasm_func_call(lVar6,&results[0].of,local_d8);
              if (lVar6 == 0) {
                wasm_extern_vec_delete(&run_func);
                printf("Printing result...\n");
                printf("> %u\n",(ulong)(uint)results[0]._0_4_);
                printf("Shutting down...\n");
                wasm_store_delete(uVar2);
                wasm_engine_delete(uVar1);
                printf("Done.\n");
                argv_local._4_4_ = 0;
              }
              else {
                printf("> Error calling function!\n");
                argv_local._4_4_ = 1;
              }
            }
          }
        }
      }
    }
    else {
      printf("> Error loading module!\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("callback.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  own wasm_functype_t* print_type = wasm_functype_new_1_1(wasm_valtype_new_i32(), wasm_valtype_new_i32());
  own wasm_func_t* print_func = wasm_func_new(store, print_type, print_callback);

  int i = 42;
  own wasm_functype_t* closure_type = wasm_functype_new_0_1(wasm_valtype_new_i32());
  own wasm_func_t* closure_func = wasm_func_new_with_env(store, closure_type, closure_callback, &i, NULL);

  wasm_functype_delete(print_type);
  wasm_functype_delete(closure_type);

  // Instantiate.
  printf("Instantiating module...\n");
  const wasm_extern_t* imports[] = {
    wasm_func_as_extern(print_func), wasm_func_as_extern(closure_func)
  };
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(print_func);
  wasm_func_delete(closure_func);

  // Extract export.
  printf("Extracting export...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size == 0) {
    printf("> Error accessing exports!\n");
    return 1;
  }
  const wasm_func_t* run_func = wasm_extern_as_func(exports.data[0]);
  if (run_func == NULL) {
    printf("> Error accessing export!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  printf("Calling export...\n");
  wasm_val_t args[2];
  args[0].kind = WASM_I32;
  args[0].of.i32 = 3;
  args[1].kind = WASM_I32;
  args[1].of.i32 = 4;
  wasm_val_t results[1];
  if (wasm_func_call(run_func, args, results)) {
    printf("> Error calling function!\n");
    return 1;
  }

  wasm_extern_vec_delete(&exports);

  // Print result.
  printf("Printing result...\n");
  printf("> %u\n", results[0].of.i32);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}